

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SubBoard.cpp
# Opt level: O0

void __thiscall SubBoard::SubBoard(SubBoard *this)

{
  ChunkDrawable *this_00;
  FlatMap<unsigned_long,_ChunkDrawable,_std::less<unsigned_long>_> *in_RDI;
  Chunk *in_stack_ffffffffffffff98;
  LodRenderer *in_stack_ffffffffffffffa0;
  pointer *this_01;
  PrimitiveType in_stack_ffffffffffffffdc;
  VertexArray *this_02;
  unsigned_long *in_stack_fffffffffffffff0;
  FlatMap<unsigned_long,_ChunkDrawable,_std::less<unsigned_long>_> *this_03;
  
  this_03 = in_RDI;
  sf::Drawable::Drawable((Drawable *)in_RDI);
  LodRenderer::LodRenderer(in_stack_ffffffffffffffa0);
  (in_RDI->vec_).
  super__Vector_base<std::pair<unsigned_long,_ChunkDrawable>,_std::allocator<std::pair<unsigned_long,_ChunkDrawable>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)&PTR__SubBoard_0047e170;
  (in_RDI->vec_).
  super__Vector_base<std::pair<unsigned_long,_ChunkDrawable>,_std::allocator<std::pair<unsigned_long,_ChunkDrawable>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)&PTR__SubBoard_0047e1a0;
  sf::Vector2<float>::Vector2
            ((Vector2<float> *)
             ((long)&in_RDI[1].vec_.
                     super__Vector_base<std::pair<unsigned_long,_ChunkDrawable>,_std::allocator<std::pair<unsigned_long,_ChunkDrawable>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 4));
  sf::Vector2<unsigned_int>::Vector2((Vector2<unsigned_int> *)&in_RDI[1].field_0x1c);
  sf::Vector2<unsigned_int>::Vector2
            ((Vector2<unsigned_int> *)
             ((long)&in_RDI[2].vec_.
                     super__Vector_base<std::pair<unsigned_long,_ChunkDrawable>,_std::allocator<std::pair<unsigned_long,_ChunkDrawable>_>_>
                     ._M_impl.super__Vector_impl_data._M_start + 4));
  this_01 = &in_RDI[2].vec_.
             super__Vector_base<std::pair<unsigned_long,_ChunkDrawable>,_std::allocator<std::pair<unsigned_long,_ChunkDrawable>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
  in_RDI[3].vec_.
  super__Vector_base<std::pair<unsigned_long,_ChunkDrawable>,_std::allocator<std::pair<unsigned_long,_ChunkDrawable>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  *(undefined8 *)&in_RDI[3].field_0x18 = 0;
  in_RDI[3].vec_.
  super__Vector_base<std::pair<unsigned_long,_ChunkDrawable>,_std::allocator<std::pair<unsigned_long,_ChunkDrawable>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  in_RDI[3].vec_.
  super__Vector_base<std::pair<unsigned_long,_ChunkDrawable>,_std::allocator<std::pair<unsigned_long,_ChunkDrawable>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  in_RDI[2].vec_.
  super__Vector_base<std::pair<unsigned_long,_ChunkDrawable>,_std::allocator<std::pair<unsigned_long,_ChunkDrawable>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  *(undefined8 *)&in_RDI[2].field_0x18 = 0;
  in_RDI[4].vec_.
  super__Vector_base<std::pair<unsigned_long,_ChunkDrawable>,_std::allocator<std::pair<unsigned_long,_ChunkDrawable>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  std::
  unordered_map<unsigned_long,_Chunk,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_Chunk>_>_>
  ::unordered_map((unordered_map<unsigned_long,_Chunk,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_Chunk>_>_>
                   *)0x208e2d);
  this_02 = (VertexArray *)0x0;
  details::make_unique<Chunk,_std::nullptr_t,_const_unsigned_long_&,_0>
            (&in_RDI[4].vec_.
              super__Vector_base<std::pair<unsigned_long,_ChunkDrawable>,_std::allocator<std::pair<unsigned_long,_ChunkDrawable>_>_>
              ._M_impl.super__Vector_impl_data._M_finish,(unsigned_long *)this_01);
  FlatMap<unsigned_long,_ChunkDrawable,_std::less<unsigned_long>_>::FlatMap
            ((FlatMap<unsigned_long,_ChunkDrawable,_std::less<unsigned_long>_> *)this_01,
             (less<unsigned_long> *)
             &in_RDI[4].vec_.
              super__Vector_base<std::pair<unsigned_long,_ChunkDrawable>,_std::allocator<std::pair<unsigned_long,_ChunkDrawable>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  ChunkCoordsRange::ChunkCoordsRange
            ((ChunkCoordsRange *)
             &in_RDI[5].vec_.
              super__Vector_base<std::pair<unsigned_long,_ChunkDrawable>,_std::allocator<std::pair<unsigned_long,_ChunkDrawable>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,0,0,0,0);
  ChunkCoordsRange::ChunkCoordsRange((ChunkCoordsRange *)(in_RDI + 6),0,0,0,0);
  in_RDI[6].vec_.
  super__Vector_base<std::pair<unsigned_long,_ChunkDrawable>,_std::allocator<std::pair<unsigned_long,_ChunkDrawable>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  sf::RenderTexture::RenderTexture((RenderTexture *)&in_RDI[6].field_0x18);
  sf::VertexArray::VertexArray(this_02,in_stack_ffffffffffffffdc,(size_t)in_RDI);
  this_00 = FlatMap<unsigned_long,_ChunkDrawable,_std::less<unsigned_long>_>::operator[]
                      (this_03,in_stack_fffffffffffffff0);
  std::unique_ptr<Chunk,_std::default_delete<Chunk>_>::get
            ((unique_ptr<Chunk,_std::default_delete<Chunk>_> *)this_00);
  ChunkDrawable::setChunk(this_00,in_stack_ffffffffffffff98);
  return;
}

Assistant:

SubBoard::SubBoard() :
    position_(),
    size_(),
    lastSize_(),
    chunks_(),
    emptyChunk_(details::make_unique<Chunk>(nullptr, LodRenderer::EMPTY_CHUNK_COORDS)),
    chunkDrawables_(),
    visibleArea_(0, 0, 0, 0),
    lastVisibleArea_(0, 0, 0, 0),
    lastTileset_(nullptr),
    texture_(),
    vertices_(sf::Triangles, 6) {

    chunkDrawables_[LodRenderer::EMPTY_CHUNK_COORDS].setChunk(emptyChunk_.get());
}